

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::actOnRuleDependency(llvm::StringRef,llvm::StringRef_
          (void *this,StringRef dependency,StringRef unescapedWord)

{
  bool bVar1;
  undefined8 uVar2;
  BuildSystemDelegate *pBVar3;
  DepsActions *pDVar4;
  ulong uVar5;
  error_code eVar6;
  StringRef SVar7;
  StringRef path;
  char *local_11a8;
  size_t local_11a0;
  BuildKey *local_1198;
  char *local_1190;
  BuildKey local_1188;
  KeyType local_1168;
  uint local_1148;
  error_category *local_1140;
  Twine local_1138;
  Twine local_1120;
  Twine local_1108;
  Twine local_10f0;
  StringRef local_10d8;
  undefined1 local_10c8 [8];
  SmallString<4096U> absPath;
  BuildKey local_98;
  KeyType local_78;
  Twine local_58;
  void *local_40;
  DepsActions *this_local;
  StringRef unescapedWord_local;
  StringRef dependency_local;
  
  unescapedWord_local.Data = (char *)unescapedWord.Length;
  pDVar4 = (DepsActions *)unescapedWord.Data;
  unescapedWord_local.Length = (size_t)dependency.Data;
  local_40 = this;
  this_local = pDVar4;
  llvm::Twine::Twine(&local_58,(StringRef *)&this_local);
  bVar1 = llvm::sys::path::is_absolute(&local_58,native);
  if (bVar1) {
    SVar7.Length = (size_t)pDVar4;
    SVar7.Data = unescapedWord_local.Data;
    BuildKey::makeNode(&local_98,(BuildKey *)this_local,SVar7);
    BuildKey::toData(&local_78,&local_98);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),&local_78);
    llbuild::core::KeyType::~KeyType(&local_78);
    BuildKey::~BuildKey(&local_98);
    pBVar3 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    absPath.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts._4088_8_
         = this_local;
    (*pBVar3->_vptr_BuildSystemDelegate[0xf])
              (pBVar3,*(undefined8 *)((long)this + 0x20),this_local,unescapedWord_local.Data,0);
  }
  else {
    uVar2 = std::__cxx11::string::data();
    local_10d8.Data = (char *)uVar2;
    uVar2 = std::__cxx11::string::length();
    local_10d8.Length = uVar2;
    llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)local_10c8,local_10d8);
    llvm::Twine::Twine(&local_10f0,(StringRef *)&this_local);
    llvm::Twine::Twine(&local_1108,"");
    llvm::Twine::Twine(&local_1120,"");
    llvm::Twine::Twine(&local_1138,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)local_10c8,&local_10f0,&local_1108,&local_1120,&local_1138);
    eVar6 = llvm::sys::fs::make_absolute((SmallVectorImpl<char> *)local_10c8);
    local_1140 = eVar6._M_cat;
    local_1148 = eVar6._M_value;
    uVar5 = (ulong)local_1148;
    SVar7 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_10c8);
    local_1198 = (BuildKey *)SVar7.Data;
    local_1190 = (char *)SVar7.Length;
    path.Length = uVar5;
    path.Data = local_1190;
    BuildKey::makeNode(&local_1188,local_1198,path);
    BuildKey::toData(&local_1168,&local_1188);
    llbuild::core::TaskInterface::discoveredDependency
              ((TaskInterface *)((long)this + 0x10),&local_1168);
    llbuild::core::KeyType::~KeyType(&local_1168);
    BuildKey::~BuildKey(&local_1188);
    pBVar3 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
    uVar2 = *(undefined8 *)((long)this + 0x20);
    SVar7 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_10c8);
    local_11a8 = SVar7.Data;
    local_11a0 = SVar7.Length;
    (*pBVar3->_vptr_BuildSystemDelegate[0xf])(pBVar3,uVar2,local_11a8,local_11a0,0);
    llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)local_10c8);
  }
  return;
}

Assistant:

virtual void actOnRuleDependency(StringRef dependency,
                                     StringRef unescapedWord) override {
      if (llvm::sys::path::is_absolute(unescapedWord)) {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
        return;
      }

      // Generate absolute path
      //
      // NOTE: This is making the assumption that relative paths coming in a
      // dependency file are in relation to the explictly set working
      // directory, or the current working directory when it has not been set.
      SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
      llvm::sys::path::append(absPath, unescapedWord);
      llvm::sys::fs::make_absolute(absPath);

      ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
    }